

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  void *__dest;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    iVar2 = *(int *)((long)&this->Layers[0].Capacity + lVar6);
    if (iVar2 < 0) {
      uVar4 = iVar2 / 2 + iVar2;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = 0;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (*GImAllocatorAllocFunc)(uVar5 * 8,GImAllocatorUserData);
      pvVar3 = *(void **)((long)&this->Layers[0].Data + lVar6);
      if (pvVar3 != (void *)0x0) {
        memcpy(__dest,pvVar3,(long)*(int *)((long)&this->Layers[0].Size + lVar6) << 3);
        pvVar3 = *(void **)((long)&this->Layers[0].Data + lVar6);
        if ((pvVar3 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
      }
      *(void **)((long)&this->Layers[0].Data + lVar6) = __dest;
      *(int *)((long)&this->Layers[0].Capacity + lVar6) = (int)uVar5;
    }
    *(undefined4 *)((long)&this->Layers[0].Size + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 == 0x10);
  return;
}

Assistant:

void Clear()            { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }